

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool CheckWitnessMalleation
               (CBlock *block,bool expect_witness_commitment,BlockValidationState *state)

{
  long lVar1;
  pointer psVar2;
  element_type *peVar3;
  pointer pCVar4;
  long *plVar5;
  undefined8 *puVar6;
  uchar *data;
  pointer psVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  pointer psVar11;
  long lVar12;
  undefined7 in_register_00000031;
  long lVar13;
  string *this;
  shared_ptr<const_CTransaction> *tx;
  long in_FS_OFFSET;
  Span<unsigned_char> output;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [32];
  uchar local_a8 [80];
  uint256 hash_witness;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000031,expect_witness_commitment) != 0) {
    bVar9 = 1;
    if (block->m_checked_witness_commitment != false) goto LAB_008c39a7;
    iVar10 = GetWitnessCommitmentIndex(block);
    if (iVar10 != -1) {
      psVar2 = (block->vtx).
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((psVar2 == (block->vtx).
                     super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) ||
         (peVar3 = (psVar2->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr,
         pCVar4 = (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start,
         pCVar4 == (peVar3->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
        __assert_fail("!block.vtx.empty() && !block.vtx[0]->vin.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0xf76,
                      "bool CheckWitnessMalleation(const CBlock &, bool, BlockValidationState &)");
      }
      plVar5 = (long *)(pCVar4->scriptWitness).stack.
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
      if (((long)*(pointer *)
                  ((long)&(pCVar4->scriptWitness).stack.
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8) - (long)plVar5 == 0x18) &&
         (plVar5[1] - *plVar5 == 0x20)) {
        BlockWitnessMerkleRoot(&hash_witness,block,(bool *)0x0);
        local_a8[0x30] = '\0';
        local_a8[0x31] = '\0';
        local_a8[0x32] = '\0';
        local_a8[0x33] = '\0';
        local_a8[0x34] = '\0';
        local_a8[0x35] = '\0';
        local_a8[0x36] = '\0';
        local_a8[0x37] = '\0';
        local_a8[0x38] = '\0';
        local_a8[0x39] = '\0';
        local_a8[0x3a] = '\0';
        local_a8[0x3b] = '\0';
        local_a8[0x3c] = '\0';
        local_a8[0x3d] = '\0';
        local_a8[0x3e] = '\0';
        local_a8[0x3f] = '\0';
        local_a8[0x20] = '\0';
        local_a8[0x21] = '\0';
        local_a8[0x22] = '\0';
        local_a8[0x23] = '\0';
        local_a8[0x24] = '\0';
        local_a8[0x25] = '\0';
        local_a8[0x26] = '\0';
        local_a8[0x27] = '\0';
        local_a8[0x28] = '\0';
        local_a8[0x29] = '\0';
        local_a8[0x2a] = '\0';
        local_a8[0x2b] = '\0';
        local_a8[0x2c] = '\0';
        local_a8[0x2d] = '\0';
        local_a8[0x2e] = '\0';
        local_a8[0x2f] = '\0';
        local_a8[0x10] = '\0';
        local_a8[0x11] = '\0';
        local_a8[0x12] = '\0';
        local_a8[0x13] = '\0';
        local_a8[0x14] = '\0';
        local_a8[0x15] = '\0';
        local_a8[0x16] = '\0';
        local_a8[0x17] = '\0';
        local_a8[0x18] = '\0';
        local_a8[0x19] = '\0';
        local_a8[0x1a] = '\0';
        local_a8[0x1b] = '\0';
        local_a8[0x1c] = '\0';
        local_a8[0x1d] = '\0';
        local_a8[0x1e] = '\0';
        local_a8[0x1f] = '\0';
        local_a8[0] = '\0';
        local_a8[1] = '\0';
        local_a8[2] = '\0';
        local_a8[3] = '\0';
        local_a8[4] = '\0';
        local_a8[5] = '\0';
        local_a8[6] = '\0';
        local_a8[7] = '\0';
        local_a8[8] = '\0';
        local_a8[9] = '\0';
        local_a8[10] = '\0';
        local_a8[0xb] = '\0';
        local_a8[0xc] = '\0';
        local_a8[0xd] = '\0';
        local_a8[0xe] = '\0';
        local_a8[0xf] = '\0';
        local_c8._16_8_ = 0;
        local_c8._24_4_ = 0;
        local_c8._28_4_ = 0;
        local_c8._0_8_ = (pointer)0x0;
        local_c8._8_8_ = 0;
        local_a8[0x40] = '\0';
        local_a8[0x41] = '\0';
        local_a8[0x42] = '\0';
        local_a8[0x43] = '\0';
        local_a8[0x44] = '\0';
        local_a8[0x45] = '\0';
        local_a8[0x46] = '\0';
        local_a8[0x47] = '\0';
        CSHA256::CSHA256((CSHA256 *)local_c8);
        CSHA256::Write((CSHA256 *)local_c8,(uchar *)&hash_witness,0x20);
        puVar6 = (undefined8 *)
                 (pCVar4->scriptWitness).stack.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        data = (uchar *)*puVar6;
        CSHA256::Write((CSHA256 *)local_c8,data,puVar6[1] - (long)data);
        output.m_size = 0x20;
        output.m_data = (uchar *)&hash_witness;
        CHash256::Finalize((CHash256 *)local_c8,output);
        lVar13 = *(long *)&(((((block->vtx).
                               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
        lVar12 = (long)iVar10 * 0x28;
        if (*(uint *)(lVar13 + 0x24 + lVar12) < 0x1d) {
          lVar13 = lVar13 + lVar12 + 8;
        }
        else {
          lVar13 = *(long *)(lVar13 + 8 + lVar12);
        }
        iVar10 = bcmp(&hash_witness,(void *)(lVar13 + 6),0x20);
        if (iVar10 == 0) {
          block->m_checked_witness_commitment = true;
          goto LAB_008c39a7;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,"bad-witness-merkle-match",&local_e9);
        tinyformat::format<char[23]>
                  (&local_e8,"%s : witness merkle commitment mismatch",
                   (char (*) [23])"CheckWitnessMalleation");
        bVar9 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                           (string *)local_c8,&local_e8);
        this = &local_e8;
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8,"bad-witness-nonce-size",(allocator<char> *)&local_e8);
        tinyformat::format<char[23]>
                  ((string *)&hash_witness,"%s : invalid witness reserved value size",
                   (char (*) [23])"CheckWitnessMalleation");
        bVar9 = ValidationState<BlockValidationResult>::Invalid
                          (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                           (string *)local_c8,(string *)&hash_witness);
        this = (string *)&hash_witness;
      }
      std::__cxx11::string::~string((string *)this);
      std::__cxx11::string::~string((string *)local_c8);
      goto LAB_008c39a7;
    }
  }
  psVar2 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar7 = (block->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    psVar11 = psVar7;
    if (psVar11 == psVar2) goto LAB_008c399d;
    psVar7 = psVar11 + 1;
  } while (((psVar11->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
           m_has_witness != true);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"unexpected-witness",(allocator<char> *)&local_e8);
  tinyformat::format<char[23]>
            ((string *)&hash_witness,"%s : unexpected witness data found",
             (char (*) [23])"CheckWitnessMalleation");
  bVar8 = ValidationState<BlockValidationResult>::Invalid
                    (&state->super_ValidationState<BlockValidationResult>,BLOCK_MUTATED,
                     (string *)local_c8,(string *)&hash_witness);
  block = (CBlock *)(ulong)bVar8;
  std::__cxx11::string::~string((string *)&hash_witness);
  std::__cxx11::string::~string((string *)local_c8);
LAB_008c399d:
  bVar9 = psVar11 == psVar2 | (byte)block;
LAB_008c39a7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar9 & 1);
  }
  __stack_chk_fail();
}

Assistant:

static bool CheckWitnessMalleation(const CBlock& block, bool expect_witness_commitment, BlockValidationState& state)
{
    if (expect_witness_commitment) {
        if (block.m_checked_witness_commitment) return true;

        int commitpos = GetWitnessCommitmentIndex(block);
        if (commitpos != NO_WITNESS_COMMITMENT) {
            assert(!block.vtx.empty() && !block.vtx[0]->vin.empty());
            const auto& witness_stack{block.vtx[0]->vin[0].scriptWitness.stack};

            if (witness_stack.size() != 1 || witness_stack[0].size() != 32) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-nonce-size",
                    /*debug_message=*/strprintf("%s : invalid witness reserved value size", __func__));
            }

            // The malleation check is ignored; as the transaction tree itself
            // already does not permit it, it is impossible to trigger in the
            // witness tree.
            uint256 hash_witness = BlockWitnessMerkleRoot(block, /*mutated=*/nullptr);

            CHash256().Write(hash_witness).Write(witness_stack[0]).Finalize(hash_witness);
            if (memcmp(hash_witness.begin(), &block.vtx[0]->vout[commitpos].scriptPubKey[6], 32)) {
                return state.Invalid(
                    /*result=*/BlockValidationResult::BLOCK_MUTATED,
                    /*reject_reason=*/"bad-witness-merkle-match",
                    /*debug_message=*/strprintf("%s : witness merkle commitment mismatch", __func__));
            }

            block.m_checked_witness_commitment = true;
            return true;
        }
    }

    // No witness data is allowed in blocks that don't commit to witness data, as this would otherwise leave room for spam
    for (const auto& tx : block.vtx) {
        if (tx->HasWitness()) {
            return state.Invalid(
                /*result=*/BlockValidationResult::BLOCK_MUTATED,
                /*reject_reason=*/"unexpected-witness",
                /*debug_message=*/strprintf("%s : unexpected witness data found", __func__));
        }
    }

    return true;
}